

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O2

bool __thiscall QMetaType::load(QMetaType *this,QDataStream *stream,void *data)

{
  DataStreamInFn p_Var1;
  bool bVar2;
  int iVar3;
  long in_FS_OFFSET;
  undefined1 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = false;
  if ((data == (void *)0x0) || (bVar2 = false, this->d_ptr == (QMetaTypeInterface *)0x0))
  goto LAB_00270064;
  iVar3 = registerHelper(this);
  if (iVar3 == 0x20) {
LAB_00270041:
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    QDataStream::operator>>(stream,(qint64 *)&local_28);
    *(undefined1 **)data = local_28;
  }
  else {
    iVar3 = registerHelper(this);
    if (iVar3 == 0x23) goto LAB_00270041;
    p_Var1 = this->d_ptr->dataStreamIn;
    if (p_Var1 == (DataStreamInFn)0x0) {
      bVar2 = false;
      goto LAB_00270064;
    }
    (*p_Var1)(this->d_ptr,stream,data);
  }
  bVar2 = true;
LAB_00270064:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QMetaType::load(QDataStream &stream, void *data) const
{
    if (!data || !isValid())
        return false;

    // keep compatibility for long/ulong
    if (id() == QMetaType::Long) {
        qlonglong ll;
        stream >> ll;
        *(long *)data = long(ll);
        return true;
    } else if (id() == QMetaType::ULong) {
        qulonglong ull;
        stream >> ull;
        *(unsigned long *)data = (unsigned long)(ull);
        return true;
    }
    if (!d_ptr->dataStreamIn)
        return false;

    d_ptr->dataStreamIn(d_ptr, stream, data);
    return true;
}